

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int encode(uint8_t *in,uint64_t *out,size_t l,uint64_t q)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint8_t uVar5;
  long lVar6;
  ulong uVar7;
  
  iVar1 = -1;
  if (out != (uint64_t *)0x0 && in != (uint8_t *)0x0) {
    lVar2 = (ulong)((l & 7) != 0) + (l >> 3);
    if (lVar2 == 0) {
      return 0;
    }
    lVar4 = 0;
    do {
      if (l != 0) {
        uVar5 = in[lVar4];
        uVar3 = l - 1;
        if (6 < uVar3) {
          uVar3 = 7;
        }
        lVar6 = 0;
        do {
          uVar7 = q >> 1;
          if (-1 < (char)uVar5) {
            uVar7 = 0;
          }
          out[lVar6] = uVar7;
          uVar5 = uVar5 * '\x02';
          lVar6 = lVar6 + 1;
        } while (uVar3 + 1 != lVar6);
        l = l - lVar6;
      }
      lVar4 = lVar4 + 1;
      out = out + 8;
    } while (lVar4 != lVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int encode(uint8_t in[], uint64_t out[], size_t l, uint64_t q) {
    if(in == NULL || out == NULL)
        return -1;

    // define possible encoding values
    uint64_t low = 0;
    uint64_t high = q/2;

    // calculate number of bytes
    size_t num_bytes = l/8;
    if(num_bytes * 8 != l)
        num_bytes++;

    // iterate over bytes and bits and encode input
    for(size_t by = 0; by < num_bytes; by++) {
        uint8_t byte = in[by];
        for(size_t bi = 0; bi < 8 && l > 0; bi++) {
            out[by*8+bi] = (byte & 0x80) ? high : low;
            byte <<= 1;
            l--;
        }
    }

    return 0;
}